

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitplanes.cpp
# Opt level: O1

void __thiscall
Amiga::BitplaneShifter::set
          (BitplaneShifter *this,BitplaneData *previous,BitplaneData *next,int odd_delay,
          int even_delay)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  bVar1 = (byte)even_delay;
  uVar5 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[0],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[0]) >> (bVar1 & 0x1f);
  bVar2 = (byte)odd_delay;
  uVar6 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[1],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[1]) >> (bVar2 & 0x1f);
  uVar8 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[2],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[2]) >> (bVar1 & 0x1f);
  uVar7 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[3],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[3]) >> (bVar2 & 0x1f);
  uVar9 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[4],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[4]) >> (bVar1 & 0x1f);
  uVar4 = (ulong)(uVar5 & 0xff) * 0x40010004001 & 0x3000300030003;
  uVar3 = CONCAT22((previous->super_array<unsigned_short,_6UL>)._M_elems[5],
                   (next->super_array<unsigned_short,_6UL>)._M_elems[5]) >> (bVar2 & 0x1f);
  (this->data_)._M_elems[0] =
       ((ulong)(uVar3 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x1020 & 0x2020202020202020 |
       ((ulong)(uVar7 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x810 & 0x1010101010101010 |
       ((ulong)(uVar6 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x408 & 0x808080808080808 |
       (uVar4 << 7 | uVar4) & 0x101010101010101 |
       ((ulong)(uVar8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x102 & 0x202020202020202 |
       ((ulong)(uVar9 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x204 & 0x404040404040404;
  uVar4 = (ulong)(uVar5 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003;
  (this->data_)._M_elems[1] =
       ((ulong)(uVar3 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x1020 & 0x2020202020202020
       | ((ulong)(uVar7 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x810 & 0x1010101010101010
         | ((ulong)(uVar6 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x408 &
           0x808080808080808 | (uVar4 << 7 | uVar4) & 0x101010101010101 |
           ((ulong)(uVar8 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x102 &
           0x202020202020202 |
         ((ulong)(uVar9 >> 8 & 0xff) * 0x40010004001 & 0x3000300030003) * 0x204 & 0x404040404040404;
  return;
}

Assistant:

void BitplaneShifter::set(const BitplaneData &previous, const BitplaneData &next, int odd_delay, int even_delay) {
	const uint16_t planes[6] = {
		uint16_t(((previous[0] << 16) | next[0]) >> even_delay),
		uint16_t(((previous[1] << 16) | next[1]) >> odd_delay),
		uint16_t(((previous[2] << 16) | next[2]) >> even_delay),
		uint16_t(((previous[3] << 16) | next[3]) >> odd_delay),
		uint16_t(((previous[4] << 16) | next[4]) >> even_delay),
		uint16_t(((previous[5] << 16) | next[5]) >> odd_delay),
	};

	// Swizzle bits into the form:
	//
	//	[b5 b3 b1 b4 b2 b0]
	//
	// ... and assume a suitably adjusted palette is in use elsewhere.
	// This makes dual playfields very easy to separate.
	data_[0] =
		(expand_bitplane_byte(uint8_t(planes[0])) << 0) |
		(expand_bitplane_byte(uint8_t(planes[2])) << 1) |
		(expand_bitplane_byte(uint8_t(planes[4])) << 2) |
		(expand_bitplane_byte(uint8_t(planes[1])) << 3) |
		(expand_bitplane_byte(uint8_t(planes[3])) << 4) |
		(expand_bitplane_byte(uint8_t(planes[5])) << 5);

	data_[1] =
		(expand_bitplane_byte(uint8_t(planes[0] >> 8)) << 0) |
		(expand_bitplane_byte(uint8_t(planes[2] >> 8)) << 1) |
		(expand_bitplane_byte(uint8_t(planes[4] >> 8)) << 2) |
		(expand_bitplane_byte(uint8_t(planes[1] >> 8)) << 3) |
		(expand_bitplane_byte(uint8_t(planes[3] >> 8)) << 4) |
		(expand_bitplane_byte(uint8_t(planes[5] >> 8)) << 5);
}